

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int decode_session_identifier
              (uint64_t *issued_at,ptls_iovec_t *psk,uint32_t *ticket_age_add,
              ptls_iovec_t *server_name,uint16_t *csid,uint8_t *src,uint8_t *end)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint8_t *end_00;
  ushort *local_38;
  
  if (1 < (ulong)((long)end - (long)src)) {
    uVar3 = (ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
    local_38 = (ushort *)(src + 2);
    if (uVar3 <= (ulong)((long)end - (long)local_38)) {
      end_00 = (uint8_t *)((long)local_38 + uVar3);
      iVar2 = decode64(issued_at,(uint8_t **)&local_38,end_00);
      if (iVar2 != 0) {
        return iVar2;
      }
      if (1 < (ulong)((long)end_00 - (long)local_38)) {
        uVar3 = (ulong)(ushort)(*local_38 << 8 | *local_38 >> 8);
        local_38 = local_38 + 1;
        if (uVar3 <= (ulong)((long)end_00 - (long)local_38)) {
          psk->base = (uint8_t *)local_38;
          local_38 = (ushort *)((long)local_38 + uVar3);
          psk->len = uVar3;
          lVar4 = (long)end_00 - (long)local_38;
          if ((1 < lVar4) && (*csid = *local_38 << 8 | *local_38 >> 8, 3 < lVar4 + -2)) {
            uVar1 = *(uint *)(local_38 + 1);
            *ticket_age_add =
                 uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
            if (1 < lVar4 - 6U) {
              uVar3 = (ulong)(ushort)(local_38[3] << 8 | local_38[3] >> 8);
              local_38 = local_38 + 4;
              if (uVar3 <= (ulong)((long)end_00 - (long)local_38)) {
                server_name->base = (uint8_t *)local_38;
                server_name->len = uVar3;
                if ((uint8_t *)((long)local_38 + uVar3) != end_00) {
                  return 0x32;
                }
                if (end_00 != end) {
                  return 0x32;
                }
                return 0;
              }
            }
          }
        }
      }
    }
  }
  return 0x32;
}

Assistant:

int decode_session_identifier(uint64_t *issued_at, ptls_iovec_t *psk, uint32_t *ticket_age_add, ptls_iovec_t *server_name,
                              uint16_t *csid, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        if ((ret = decode64(issued_at, &src, end)) != 0)
            goto Exit;
        decode_open_block(src, end, 2, {
            *psk = ptls_iovec_init(src, end - src);
            src = end;
        });
        if ((ret = decode16(csid, &src, end)) != 0)
            goto Exit;
        if ((ret = decode32(ticket_age_add, &src, end)) != 0)
            goto Exit;
        decode_open_block(src, end, 2, {
            *server_name = ptls_iovec_init(src, end - src);
            src = end;
        });
    });

Exit:
    return ret;
}